

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_aliases.h
# Opt level: O1

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,4ul,unsigned_char,12ul,date::character_t<char>&,date::unsigned_integer_t<unsigned_short,2u,4u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               aliases_t<char,_4UL,_unsigned_char,_12UL> *fmt,character_t<char> *others,
               unsigned_integer_t<unsigned_short,_2U,_4U> *others_1,character_t<char> *others_2,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_3,character_t<char> *others_4,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_5,
               optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>
               *others_6,character_t<char> *others_7,
               cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others_8)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  pair<date::static_string<char,_4UL>,_unsigned_char> *ppVar4;
  long lVar5;
  long lVar6;
  byte unaff_BPL;
  ulong uVar7;
  size_t i;
  bool bVar8;
  array<bool,_12UL> is_match;
  array<const_char_*,_12UL> str_list;
  
  ppVar4 = fmt->aliases->_M_elems;
  lVar5 = 0;
  do {
    str_list._M_elems[lVar5] = (char *)ppVar4;
    is_match._M_elems[lVar5] =
         (((pair<date::static_string<char,_4UL>,_unsigned_char> *)&ppVar4->first)->first).m_length
         != 0;
    lVar5 = lVar5 + 1;
    ppVar4 = ppVar4 + 1;
  } while (lVar5 != 0xc);
  lVar5 = 0;
  do {
    if (end->m_position == pos->m_position) break;
    cVar1 = pos->m_cache[pos->m_position];
    lVar6 = 2;
    bVar8 = false;
    uVar7 = 0;
    do {
      if (is_match._M_elems[uVar7] == true) {
        pcVar2 = str_list._M_elems[uVar7];
        if (*pcVar2 == cVar1) {
          if (pcVar2[1] != '\0') {
            str_list._M_elems[uVar7] = pcVar2 + 1;
            goto LAB_00107fb2;
          }
          iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
          *fmt->value = (&fmt->aliases->_M_elems[0].first.m_data)[lVar6 * 2]._M_elems[0];
          unaff_BPL = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,date::unsigned_integer_t<unsigned_short,2u,4u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
                                (pos,end,others,others_1,others_2,others_3,others_4,others_5,
                                 others_6,others_7,others_8);
          bVar3 = false;
        }
        else {
          is_match._M_elems[uVar7] = false;
LAB_00107fb2:
          bVar3 = true;
        }
        if (!bVar3) break;
      }
      bVar8 = 10 < uVar7;
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 3;
    } while (uVar7 != 0xc);
    if (!bVar8) goto LAB_00108070;
    lVar5 = lVar5 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
  } while (lVar5 != 4);
  unaff_BPL = 0;
LAB_00108070:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, aliases_t<Char, Length, Value, Count>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    std::array<const Char*, Count> str_list;
    std::array<bool, Count> is_match;
    for (std::size_t k = 0; k < Count; ++k)
    {
        const auto& str = fmt.aliases[k].first;
        str_list[k] = str.c_str();
        is_match[k] = !str.empty();
    }

    for (std::size_t i = 0; i < Length; ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        for (std::size_t k = 0; k < Count; ++k)
        {
            if (!is_match[k])
                continue;
            
            const Char* str = str_list[k];
            if (*str != ch)
            {
                is_match[k] = false;
                continue;
            }

            ++str;
            if (*str != Char{ '\0' })
            {
                str_list[k] = str;
                continue;
            }

            ++pos;
            fmt.value = fmt.aliases[k].second;
            return read_impl(pos, end, std::forward<Others>(others)...);
        }
    }

    return false;
}